

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O1

int htmlSetMetaEncoding(htmlDocPtr doc,xmlChar *encoding)

{
  _xmlAttr *p_Var1;
  xmlChar *str1;
  int iVar2;
  xmlChar *pxVar3;
  xmlNodePtr pxVar4;
  bool bVar5;
  _xmlNode *p_Var6;
  _xmlNode *p_Var7;
  char newcontent [100];
  _xmlNode *local_b0;
  xmlChar local_98 [99];
  undefined1 local_35;
  
  local_98[0] = '\0';
  if (doc == (htmlDocPtr)0x0) {
    return -1;
  }
  iVar2 = xmlStrcasecmp(encoding,"html");
  if (iVar2 == 0) {
    return -1;
  }
  if (encoding != (xmlChar *)0x0) {
    snprintf((char *)local_98,100,"text/html; charset=%s");
    local_35 = 0;
  }
  p_Var6 = doc->children;
  if (p_Var6 == (_xmlNode *)0x0) {
    return -1;
  }
  local_b0 = (_xmlNode *)0x0;
  do {
    if ((p_Var6->type == XML_ELEMENT_NODE) && (p_Var6->name != (xmlChar *)0x0)) {
      iVar2 = xmlStrcasecmp(p_Var6->name,"html");
      if (iVar2 == 0) {
        p_Var6 = p_Var6->children;
        break;
      }
      iVar2 = xmlStrcasecmp(p_Var6->name,"head");
      if (iVar2 == 0) goto LAB_0016d559;
      iVar2 = xmlStrcasecmp(p_Var6->name,(xmlChar *)"meta");
      p_Var7 = p_Var6;
      if (iVar2 == 0) goto LAB_0016d56e;
    }
    p_Var6 = p_Var6->next;
    if (p_Var6 == (_xmlNode *)0x0) {
      return -1;
    }
  } while( true );
joined_r0x0016d507:
  if (p_Var6 == (_xmlNode *)0x0) {
    return -1;
  }
  if ((p_Var6->type == XML_ELEMENT_NODE) && (p_Var6->name != (xmlChar *)0x0)) {
    iVar2 = xmlStrcasecmp(p_Var6->name,"head");
    if (iVar2 == 0) goto LAB_0016d559;
    iVar2 = xmlStrcasecmp(p_Var6->name,(xmlChar *)"meta");
    if (iVar2 == 0) {
      local_b0 = p_Var6->parent;
      p_Var7 = p_Var6;
      goto LAB_0016d56e;
    }
  }
  p_Var6 = p_Var6->next;
  goto joined_r0x0016d507;
LAB_0016d559:
  p_Var7 = p_Var6->children;
  local_b0 = p_Var6;
  if (p_Var6->children == (_xmlNode *)0x0) {
    pxVar3 = (xmlChar *)0x0;
    pxVar4 = (xmlNodePtr)0x0;
  }
  else {
LAB_0016d56e:
    pxVar3 = (xmlChar *)0x0;
    do {
      if (((p_Var7->type == XML_ELEMENT_NODE) && (p_Var7->name != (xmlChar *)0x0)) &&
         (iVar2 = xmlStrcasecmp(p_Var7->name,(xmlChar *)"meta"), iVar2 == 0)) {
        bVar5 = false;
        pxVar3 = (xmlChar *)0x0;
        for (p_Var1 = p_Var7->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
          p_Var6 = p_Var1->children;
          if (((p_Var6 != (_xmlNode *)0x0) && (p_Var6->type == XML_TEXT_NODE)) &&
             (p_Var6->next == (_xmlNode *)0x0)) {
            str1 = p_Var6->content;
            iVar2 = xmlStrcasecmp(p_Var1->name,(xmlChar *)"http-equiv");
            if ((iVar2 == 0) && (iVar2 = xmlStrcasecmp(str1,(xmlChar *)"Content-Type"), iVar2 == 0))
            {
              bVar5 = true;
            }
            else if ((str1 != (xmlChar *)0x0) &&
                    (iVar2 = xmlStrcasecmp(p_Var1->name,"content"), iVar2 == 0)) {
              pxVar3 = str1;
            }
            if ((bVar5) && (pxVar3 != (xmlChar *)0x0)) {
              bVar5 = true;
              break;
            }
          }
        }
        pxVar4 = p_Var7;
        if ((bool)(bVar5 & pxVar3 != (xmlChar *)0x0)) break;
      }
      p_Var7 = p_Var7->next;
      pxVar4 = (xmlNodePtr)0x0;
    } while (p_Var7 != (_xmlNode *)0x0);
  }
  if (pxVar4 == (xmlNodePtr)0x0) {
    if (encoding == (xmlChar *)0x0) {
      return 0;
    }
    if (local_b0 == (xmlNodePtr)0x0) {
      return 0;
    }
    pxVar4 = xmlNewDocNode(doc,(xmlNsPtr)0x0,(xmlChar *)"meta",(xmlChar *)0x0);
    if (local_b0->children == (xmlNodePtr)0x0) {
      xmlAddChild(local_b0,pxVar4);
    }
    else {
      xmlAddPrevSibling(local_b0->children,pxVar4);
    }
    xmlNewProp(pxVar4,(xmlChar *)"http-equiv",(xmlChar *)"Content-Type");
    xmlNewProp(pxVar4,"content",local_98);
  }
  else {
    if (encoding != (xmlChar *)0x0) {
      pxVar3 = xmlStrcasestr(pxVar3,encoding);
      if (pxVar3 != (xmlChar *)0x0) {
        return 0;
      }
      xmlSetProp(pxVar4,"content",local_98);
      return 0;
    }
    xmlUnlinkNode(pxVar4);
    xmlFreeNode(pxVar4);
  }
  return 0;
}

Assistant:

int
htmlSetMetaEncoding(htmlDocPtr doc, const xmlChar *encoding) {
    htmlNodePtr cur, meta = NULL, head = NULL;
    const xmlChar *content = NULL;
    char newcontent[100];

    newcontent[0] = 0;

    if (doc == NULL)
	return(-1);

    /* html isn't a real encoding it's just libxml2 way to get entities */
    if (!xmlStrcasecmp(encoding, BAD_CAST "html"))
        return(-1);

    if (encoding != NULL) {
	snprintf(newcontent, sizeof(newcontent), "text/html; charset=%s",
                (char *)encoding);
	newcontent[sizeof(newcontent) - 1] = 0;
    }

    cur = doc->children;

    /*
     * Search the html
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"html") == 0)
		break;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"head") == 0)
		goto found_head;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0)
		goto found_meta;
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(-1);
    cur = cur->children;

    /*
     * Search the head
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"head") == 0)
		break;
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0) {
                head = cur->parent;
		goto found_meta;
            }
	}
	cur = cur->next;
    }
    if (cur == NULL)
	return(-1);
found_head:
    head = cur;
    if (cur->children == NULL)
        goto create;
    cur = cur->children;

found_meta:
    /*
     * Search and update all the remaining the meta elements carrying
     * encoding information
     */
    while (cur != NULL) {
	if ((cur->type == XML_ELEMENT_NODE) && (cur->name != NULL)) {
	    if (xmlStrcasecmp(cur->name, BAD_CAST"meta") == 0) {
		xmlAttrPtr attr = cur->properties;
		int http;
		const xmlChar *value;

		content = NULL;
		http = 0;
		while (attr != NULL) {
		    if ((attr->children != NULL) &&
		        (attr->children->type == XML_TEXT_NODE) &&
		        (attr->children->next == NULL)) {
			value = attr->children->content;
			if ((!xmlStrcasecmp(attr->name, BAD_CAST"http-equiv"))
			 && (!xmlStrcasecmp(value, BAD_CAST"Content-Type")))
			    http = 1;
			else
                        {
                           if ((value != NULL) &&
                               (!xmlStrcasecmp(attr->name, BAD_CAST"content")))
			       content = value;
                        }
		        if ((http != 0) && (content != NULL))
			    break;
		    }
		    attr = attr->next;
		}
		if ((http != 0) && (content != NULL)) {
		    meta = cur;
		    break;
		}

	    }
	}
	cur = cur->next;
    }
create:
    if (meta == NULL) {
        if ((encoding != NULL) && (head != NULL)) {
            /*
             * Create a new Meta element with the right attributes
             */

            meta = xmlNewDocNode(doc, NULL, BAD_CAST"meta", NULL);
            if (head->children == NULL)
                xmlAddChild(head, meta);
            else
                xmlAddPrevSibling(head->children, meta);
            xmlNewProp(meta, BAD_CAST"http-equiv", BAD_CAST"Content-Type");
            xmlNewProp(meta, BAD_CAST"content", BAD_CAST newcontent);
        }
    } else {
        /* remove the meta tag if NULL is passed */
        if (encoding == NULL) {
            xmlUnlinkNode(meta);
            xmlFreeNode(meta);
        }
        /* change the document only if there is a real encoding change */
        else if (xmlStrcasestr(content, encoding) == NULL) {
            xmlSetProp(meta, BAD_CAST"content", BAD_CAST newcontent);
        }
    }


    return(0);
}